

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

whisper_context *
whisper_init_from_buffer_with_params(void *buffer,size_t buffer_size,whisper_context_params params)

{
  whisper_context *ctx_00;
  whisper_state *pwVar1;
  buf_context ctx;
  whisper_model_loader loader;
  void *local_40;
  size_t local_38;
  undefined8 local_30;
  whisper_model_loader local_28;
  
  local_30 = 0;
  local_40 = buffer;
  local_38 = buffer_size;
  whisper_log_internal
            (GGML_LOG_LEVEL_INFO,"%s: loading model from buffer\n",
             "whisper_init_from_buffer_with_params_no_state");
  local_28.read = whisper_init_from_buffer_with_params_no_state::anon_class_1_0_00000001::__invoke;
  local_28.eof = whisper_init_from_buffer_with_params_no_state::anon_class_1_0_00000001::__invoke;
  local_28.close = whisper_init_from_buffer_with_params_no_state::anon_class_1_0_00000001::__invoke;
  local_28.context = &local_40;
  ctx_00 = whisper_init_with_params_no_state(&local_28,params);
  if (ctx_00 != (whisper_context *)0x0) {
    pwVar1 = whisper_init_state((whisper_context *)params.dtw_aheads.heads);
    ctx_00->state = pwVar1;
    if (pwVar1 != (whisper_state *)0x0) {
      return ctx_00;
    }
    whisper_free(ctx_00);
  }
  return (whisper_context *)0x0;
}

Assistant:

struct whisper_context * whisper_init_from_buffer_with_params(void * buffer, size_t buffer_size, struct whisper_context_params params) {
    whisper_context * ctx = whisper_init_from_buffer_with_params_no_state(buffer, buffer_size, params);
    if (!ctx) {
        return nullptr;
    }

    ctx->state = whisper_init_state(ctx);
    if (!ctx->state) {
        whisper_free(ctx);
        return nullptr;
    }

    return ctx;
}